

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

int sat_solver3_minimize_assumptions(sat_solver3 *s,int *pLits,int nLits,int nConfLimit)

{
  ABC_INT64_T AVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int Temp;
  int status;
  int nResR;
  int nResL;
  int nLitsR;
  int nLitsL;
  int k;
  int i;
  int nConfLimit_local;
  int nLits_local;
  int *pLits_local;
  sat_solver3 *s_local;
  
  if (nLits == 1) {
    AVar1 = s->nConfLimit;
    s->nConfLimit = (long)nConfLimit;
    iVar2 = sat_solver3_solve_internal(s);
    s->nConfLimit = (long)(int)AVar1;
    s_local._4_4_ = (uint)(iVar2 != -1);
  }
  else {
    if (nLits < 2) {
      __assert_fail("nLits >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                    ,0x865,"int sat_solver3_minimize_assumptions(sat_solver3 *, int *, int, int)");
    }
    iVar2 = nLits / 2;
    for (nLitsL = 0; nLitsL < iVar2; nLitsL = nLitsL + 1) {
      iVar3 = sat_solver3_push(s,pLits[nLitsL]);
      if (iVar3 == 0) {
        for (nLitsR = nLitsL; -1 < nLitsR; nLitsR = nLitsR + -1) {
          sat_solver3_pop(s);
        }
        iVar2 = sat_solver3_minimize_assumptions(s,pLits,nLitsL + 1,nConfLimit);
        return iVar2;
      }
    }
    iVar3 = sat_solver3_minimize_assumptions(s,pLits + iVar2,nLits - iVar2,nConfLimit);
    for (nLitsL = 0; nLitsL < iVar2; nLitsL = nLitsL + 1) {
      sat_solver3_pop(s);
    }
    veci_resize(&s->temp_clause,0);
    for (nLitsL = 0; nLitsL < iVar2; nLitsL = nLitsL + 1) {
      veci_push(&s->temp_clause,pLits[nLitsL]);
    }
    for (nLitsL = 0; nLitsL < iVar3; nLitsL = nLitsL + 1) {
      pLits[nLitsL] = pLits[iVar2 + nLitsL];
    }
    for (nLitsL = 0; nLitsL < iVar2; nLitsL = nLitsL + 1) {
      piVar5 = veci_begin(&s->temp_clause);
      pLits[iVar3 + nLitsL] = piVar5[nLitsL];
    }
    for (nLitsL = 0; nLitsL < iVar3; nLitsL = nLitsL + 1) {
      iVar4 = sat_solver3_push(s,pLits[nLitsL]);
      if (iVar4 == 0) {
        for (nLitsR = nLitsL; -1 < nLitsR; nLitsR = nLitsR + -1) {
          sat_solver3_pop(s);
        }
        iVar2 = sat_solver3_minimize_assumptions(s,pLits,nLitsL + 1,nConfLimit);
        return iVar2;
      }
    }
    iVar2 = sat_solver3_minimize_assumptions(s,pLits + iVar3,iVar2,nConfLimit);
    for (nLitsL = 0; nLitsL < iVar3; nLitsL = nLitsL + 1) {
      sat_solver3_pop(s);
    }
    s_local._4_4_ = iVar3 + iVar2;
  }
  return s_local._4_4_;
}

Assistant:

int sat_solver3_minimize_assumptions( sat_solver3* s, int * pLits, int nLits, int nConfLimit )
{
    int i, k, nLitsL, nLitsR, nResL, nResR;
    if ( nLits == 1 )
    {
        // since the problem is UNSAT, we will try to solve it without assuming the last literal
        // if the result is UNSAT, the last literal can be dropped; otherwise, it is needed
        int status = l_False;
        int Temp = s->nConfLimit; 
        s->nConfLimit = nConfLimit;
        status = sat_solver3_solve_internal( s );
        s->nConfLimit = Temp;
        return (int)(status != l_False); // return 1 if the problem is not UNSAT
    }
    assert( nLits >= 2 );
    nLitsL = nLits / 2;
    nLitsR = nLits - nLitsL;
    // assume the left lits
    for ( i = 0; i < nLitsL; i++ )
        if ( !sat_solver3_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver3_pop(s);
            return sat_solver3_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve for the right lits
    nResL = sat_solver3_minimize_assumptions( s, pLits + nLitsL, nLitsR, nConfLimit );
    for ( i = 0; i < nLitsL; i++ )
        sat_solver3_pop(s);
    // swap literals
//    assert( nResL <= nLitsL );
//    for ( i = 0; i < nResL; i++ )
//        ABC_SWAP( int, pLits[i], pLits[nLitsL+i] );
    veci_resize( &s->temp_clause, 0 );
    for ( i = 0; i < nLitsL; i++ )
        veci_push( &s->temp_clause, pLits[i] );
    for ( i = 0; i < nResL; i++ )
        pLits[i] = pLits[nLitsL+i];
    for ( i = 0; i < nLitsL; i++ )
        pLits[nResL+i] = veci_begin(&s->temp_clause)[i];
    // assume the right lits
    for ( i = 0; i < nResL; i++ )
        if ( !sat_solver3_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver3_pop(s);
            return sat_solver3_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve for the left lits
    nResR = sat_solver3_minimize_assumptions( s, pLits + nResL, nLitsL, nConfLimit );
    for ( i = 0; i < nResL; i++ )
        sat_solver3_pop(s);
    return nResL + nResR;
}